

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O1

int Abc_NtkResynthesize(Abc_Ntk_t *pNtk,Res_Par_t *pPars)

{
  Abc_Obj_t *pNode;
  Res_Win_t *pRVar1;
  Res_Sim_t *pRVar2;
  int iVar3;
  int iVar4;
  Res_Man_t *p;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  Vec_Vec_t *pVVar7;
  Sto_Man_t *pSVar8;
  Kit_Graph_t *pGraph;
  long lVar9;
  long lVar10;
  Hop_Obj_t *pFunc;
  long lVar11;
  long lVar12;
  timespec ts;
  uint *puTruth;
  timespec local_70;
  ProgressBar *local_60;
  Hop_Obj_t *local_58;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  uint *local_38;
  
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  p = Res_ManAlloc(pPars);
  iVar3 = Abc_NtkGetTotalFanins(pNtk);
  p->nTotalNets = iVar3;
  p->nTotalNodes = pNtk->nObjCounts[7];
  iVar3 = Abc_NtkGetFaninMax(pNtk);
  local_48 = 8;
  if (iVar3 < 8) {
    local_48 = iVar3;
  }
  iVar4 = 0;
  Abc_NtkSweep(pNtk,0);
  iVar3 = Abc_NtkToAig(pNtk);
  if (iVar3 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    Res_ManFree(p);
  }
  else {
    local_40 = lVar12;
    if (pNtk->ntkFunc != ABC_FUNC_AIG) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                    ,0xf3,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
    }
    Abc_NtkLevel(pNtk);
    Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
    local_44 = pNtk->vObjs->nSize;
    p_00 = Extra_ProgressBarStart((FILE *)_stdout,local_44);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar12 = 0;
      local_60 = p_00;
      do {
        pNode = (Abc_Obj_t *)pVVar5->pArray[lVar12];
        if (pNode != (Abc_Obj_t *)0x0) {
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar12)) {
            Extra_ProgressBarUpdate_int(p_00,(int)lVar12,(char *)0x0);
          }
          if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanins).nSize < 9)) {
            if (local_44 < pNode->Id) break;
            iVar3 = clock_gettime(3,&local_70);
            if (iVar3 < 0) {
              lVar9 = 1;
            }
            else {
              lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
              lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
            }
            iVar3 = p->pPars->nWindow;
            iVar3 = Res_WinCompute(pNode,iVar3 / 10,iVar3 % 10,p->pWin);
            iVar4 = clock_gettime(3,&local_70);
            if (iVar4 < 0) {
              lVar10 = -1;
            }
            else {
              lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
            }
            p->timeWin = p->timeWin + lVar10 + lVar9;
            p_00 = local_60;
            if (iVar3 != 0) {
              iVar3 = Res_WinIsTrivial(p->pWin);
              p->nWinsTriv = p->nWinsTriv + iVar3;
              if (p->pPars->fVeryVerbose != 0) {
                printf("%5d (lev=%2d) : ",(ulong)(uint)pNode->Id,
                       (ulong)(*(uint *)&pNode->field_0x14 >> 0xc));
                pRVar1 = p->pWin;
                printf("Win = %3d/%3d/%4d/%3d   ",(ulong)(uint)pRVar1->vLeaves->nSize,
                       (ulong)(uint)pRVar1->vBranches->nSize,(ulong)(uint)pRVar1->vNodes->nSize,
                       (ulong)(uint)pRVar1->vRoots->nSize);
              }
              iVar3 = clock_gettime(3,&local_70);
              if (iVar3 < 0) {
                lVar9 = 1;
              }
              else {
                lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              pRVar1 = p->pWin;
              iVar3 = Abc_ObjRequiredLevel(pNode);
              Res_WinDivisors(pRVar1,iVar3 + -1);
              iVar3 = clock_gettime(3,&local_70);
              if (iVar3 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeDiv = p->timeDiv + lVar10 + lVar9;
              p->nWins = p->nWins + 1;
              p->nWinNodes = p->nWinNodes + p->pWin->vNodes->nSize;
              p->nDivNodes = p->nDivNodes + p->pWin->vDivs->nSize;
              if (p->pPars->fVeryVerbose != 0) {
                printf("D = %3d ");
                printf("D+ = %3d ",(ulong)(uint)p->pWin->nDivsPlus);
              }
              iVar3 = clock_gettime(3,&local_70);
              if (iVar3 < 0) {
                lVar9 = 1;
              }
              else {
                lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              if (p->pAig != (Abc_Ntk_t *)0x0) {
                Abc_NtkDelete(p->pAig);
              }
              pAVar6 = Res_WndStrash(p->pWin);
              p->pAig = pAVar6;
              iVar3 = clock_gettime(3,&local_70);
              if (iVar3 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeAig = p->timeAig + lVar10 + lVar9;
              if (p->pPars->fVeryVerbose != 0) {
                printf("AIG = %4d ",(ulong)(uint)p->pAig->nObjCounts[7]);
                putchar(10);
              }
              iVar3 = clock_gettime(3,&local_70);
              if (iVar3 < 0) {
                lVar9 = 1;
              }
              else {
                lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              iVar3 = Res_SimPrepare(p->pSim,p->pAig,p->pWin->vLeaves->nSize,0);
              iVar4 = clock_gettime(3,&local_70);
              p_00 = local_60;
              if (iVar4 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar10 + lVar9;
              if (iVar3 == 0) {
                p->nSimEmpty = p->nSimEmpty + 1;
              }
              else {
                pRVar2 = p->pSim;
                if ((pRVar2->fConst0 == 0) && (pRVar2->fConst1 == 0)) {
                  iVar3 = clock_gettime(3,&local_70);
                  if (iVar3 < 0) {
                    lVar9 = 1;
                  }
                  else {
                    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_70.tv_sec * -1000000;
                  }
                  iVar3 = Res_FilterCandidates
                                    (p->pWin,p->pAig,p->pSim,p->vResubs,p->vResubsW,local_48,
                                     (uint)(p->pPars->fArea != 0));
                  iVar4 = clock_gettime(3,&local_70);
                  if (iVar4 < 0) {
                    lVar10 = -1;
                  }
                  else {
                    lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                  }
                  p->timeCand = p->timeCand + lVar10 + lVar9;
                  p->nCandSets = p->nCandSets + iVar3;
                  p_00 = local_60;
                  if (iVar3 != 0) {
                    p->nWinsUsed = p->nWinsUsed + 1;
                    pVVar7 = p->vResubs;
                    if (0 < pVVar7->nSize) {
                      lVar9 = 0;
                      do {
                        local_58 = (Hop_Obj_t *)pVVar7->pArray[lVar9];
                        p_00 = local_60;
                        if (*(int *)((long)&local_58->field_0 + 4) == 0) break;
                        iVar3 = clock_gettime(3,&local_70);
                        if (iVar3 < 0) {
                          lVar10 = 1;
                        }
                        else {
                          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8
                                         );
                          lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
                        }
                        if (p->pCnf != (Sto_Man_t *)0x0) {
                          Sto_ManFree(p->pCnf);
                        }
                        pSVar8 = (Sto_Man_t *)Res_SatProveUnsat(p->pAig,(Vec_Ptr_t *)local_58);
                        p->pCnf = pSVar8;
                        if (pSVar8 == (Sto_Man_t *)0x0) {
                          iVar3 = clock_gettime(3,&local_70);
                          if (iVar3 < 0) {
                            lVar11 = -1;
                          }
                          else {
                            lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeSatSat = p->timeSatSat + lVar11 + lVar10;
                        }
                        else {
                          iVar3 = clock_gettime(3,&local_70);
                          if (iVar3 < 0) {
                            lVar11 = -1;
                          }
                          else {
                            lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeSatUnsat = p->timeSatUnsat + lVar11 + lVar10;
                          p->nProvedSets = p->nProvedSets + 1;
                          iVar3 = clock_gettime(3,&local_70);
                          if (iVar3 < 0) {
                            lVar10 = 1;
                          }
                          else {
                            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec)
                                            ,8);
                            lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000
                            ;
                          }
                          local_4c = Int_ManInterpolate(p->pMan,p->pCnf,0,&local_38);
                          iVar3 = clock_gettime(3,&local_70);
                          if (iVar3 < 0) {
                            lVar11 = -1;
                          }
                          else {
                            lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeInt = p->timeInt + lVar11 + lVar10;
                          if (local_4c == *(int *)((long)&local_58->field_0 + 4) + -2) {
                            if (local_38 == (uint *)0x0) {
                              __assert_fail("puTruth",
                                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                                            ,0x17c,
                                            "int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
                            }
                            pGraph = Kit_TruthToGraph(local_38,local_4c,p->vMem);
                            local_58 = Kit_GraphToHop((Hop_Man_t *)pNtk->pManFunc,pGraph);
                            Kit_GraphFree(pGraph);
                            iVar3 = clock_gettime(3,&local_70);
                            if (iVar3 < 0) {
                              lVar10 = 1;
                            }
                            else {
                              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                                              SEXT816(local_70.tv_nsec),8);
                              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) +
                                       local_70.tv_sec * -1000000;
                            }
                            if (p->vResubsW->nSize <= (int)lVar9) goto LAB_0047fc7a;
                            Res_UpdateNetwork(pNode,(Vec_Ptr_t *)p->vResubsW->pArray[lVar9],local_58
                                              ,p->vLevels);
                            iVar3 = clock_gettime(3,&local_70);
                            if (iVar3 < 0) {
                              lVar9 = -1;
                            }
                            else {
                              lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                            }
                            p->timeUpd = p->timeUpd + lVar9 + lVar10;
                            p_00 = local_60;
                            break;
                          }
                        }
                        lVar9 = lVar9 + 1;
                        pVVar7 = p->vResubs;
                        p_00 = local_60;
                      } while (lVar9 < pVVar7->nSize);
                    }
                  }
                }
                else {
                  p->nConstsUsed = p->nConstsUsed + 1;
                  if (pRVar2->fConst1 == 0) {
                    pFunc = (Hop_Obj_t *)(*(ulong *)((long)pNtk->pManFunc + 0x18) ^ 1);
                  }
                  else {
                    pFunc = *(Hop_Obj_t **)((long)pNtk->pManFunc + 0x18);
                  }
                  if (p->vResubsW->nSize < 1) {
LAB_0047fc7a:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                  }
                  pVVar5 = (Vec_Ptr_t *)*p->vResubsW->pArray;
                  pVVar5->nSize = 0;
                  Res_UpdateNetwork(pNode,pVVar5,pFunc,p->vLevels);
                }
              }
            }
          }
        }
        lVar12 = lVar12 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar12 < pVVar5->nSize);
    }
    Extra_ProgressBarStop(p_00);
    Abc_NtkStopReverseLevels(pNtk);
    lVar12 = p->timeSatSim + p->pSim->timeSat;
    p->timeSatSim = lVar12;
    p->timeSatTotal = lVar12 + p->timeSatSat + p->timeSatUnsat;
    iVar3 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNets2 = iVar3;
    p->nTotalNodes2 = pNtk->nObjCounts[7];
    iVar3 = clock_gettime(3,&local_70);
    lVar12 = local_40;
    lVar10 = -1;
    lVar9 = -1;
    if (-1 < iVar3) {
      lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    p->timeTotal = lVar9 - local_40;
    Res_ManFree(p);
    iVar3 = clock_gettime(3,&local_70);
    if (-1 < iVar3) {
      lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    s_ResynTime = s_ResynTime + (lVar10 - lVar12);
    iVar3 = Abc_NtkCheck(pNtk);
    iVar4 = 1;
    if (iVar3 == 0) {
      fwrite("Abc_NtkResynthesize(): Network check has failed.\n",0x31,1,_stdout);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Abc_NtkResynthesize( Abc_Ntk_t * pNtk, Res_Par_t * pPars )
{
    ProgressBar * pProgress;
    Res_Man_t * p;
    Abc_Obj_t * pObj;
    Hop_Obj_t * pFunc;
    Kit_Graph_t * pGraph;
    Vec_Ptr_t * vFanins;
    unsigned * puTruth;
    int i, k, RetValue, nNodesOld, nFanins, nFaninsMax;
    abctime clk, clkTotal = Abc_Clock();

    // start the manager
    p = Res_ManAlloc( pPars );
    p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    nFaninsMax = Abc_NtkGetFaninMax(pNtk);
    if ( nFaninsMax > 8 )
        nFaninsMax = 8;

    // perform the network sweep
    Abc_NtkSweep( pNtk, 0 );

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        Res_ManFree( p );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // try resynthesizing nodes in the topological order
    nNodesOld = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodesOld );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) > 8 )
            continue;
        if ( pObj->Id > nNodesOld )
            break;

        // create the window for this node
clk = Abc_Clock();
        RetValue = Res_WinCompute( pObj, p->pPars->nWindow/10, p->pPars->nWindow%10, p->pWin );
p->timeWin += Abc_Clock() - clk;
        if ( !RetValue )
            continue;
        p->nWinsTriv += Res_WinIsTrivial( p->pWin );

        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d (lev=%2d) : ", pObj->Id, pObj->Level );
            printf( "Win = %3d/%3d/%4d/%3d   ", 
                Vec_PtrSize(p->pWin->vLeaves), 
                Vec_PtrSize(p->pWin->vBranches),
                Vec_PtrSize(p->pWin->vNodes), 
                Vec_PtrSize(p->pWin->vRoots) );
        }

        // collect the divisors
clk = Abc_Clock();
        Res_WinDivisors( p->pWin, Abc_ObjRequiredLevel(pObj) - 1 );
p->timeDiv += Abc_Clock() - clk;

        p->nWins++;
        p->nWinNodes += Vec_PtrSize(p->pWin->vNodes);
        p->nDivNodes += Vec_PtrSize( p->pWin->vDivs);

        if ( p->pPars->fVeryVerbose )
        {
            printf( "D = %3d ", Vec_PtrSize(p->pWin->vDivs) );
            printf( "D+ = %3d ", p->pWin->nDivsPlus );
        }

        // create the AIG for the window
clk = Abc_Clock();
        if ( p->pAig ) Abc_NtkDelete( p->pAig );
        p->pAig = Res_WndStrash( p->pWin );
p->timeAig += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
        {
            printf( "AIG = %4d ", Abc_NtkNodeNum(p->pAig) );
            printf( "\n" );
        }
 
        // prepare simulation info
clk = Abc_Clock();
        RetValue = Res_SimPrepare( p->pSim, p->pAig, Vec_PtrSize(p->pWin->vLeaves), 0 ); //p->pPars->fVerbose );
p->timeSim += Abc_Clock() - clk;
        if ( !RetValue )
        {
            p->nSimEmpty++;
            continue;
        }

        // consider the case of constant node
        if ( p->pSim->fConst0 || p->pSim->fConst1 )
        {
            p->nConstsUsed++;

            pFunc = p->pSim->fConst1? Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc) : Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
            vFanins = Vec_VecEntry( p->vResubsW, 0 );
            Vec_PtrClear( vFanins );
            Res_UpdateNetwork( pObj, vFanins, pFunc, p->vLevels );
            continue;
        }

//        printf( " " );

        // find resub candidates for the node
clk = Abc_Clock();
        if ( p->pPars->fArea )
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 1 );
        else
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 0 );
p->timeCand += Abc_Clock() - clk;
        p->nCandSets += RetValue;
        if ( RetValue == 0 )
            continue;

//        printf( "%d(%d) ", Vec_PtrSize(p->pWin->vDivs), RetValue );

        p->nWinsUsed++;

        // iterate through candidate resubstitutions
        Vec_VecForEachLevel( p->vResubs, vFanins, k )
        {
            if ( Vec_PtrSize(vFanins) == 0 )
                break;

            // solve the SAT problem and get clauses
clk = Abc_Clock();
            if ( p->pCnf ) Sto_ManFree( p->pCnf );
            p->pCnf = (Sto_Man_t *)Res_SatProveUnsat( p->pAig, vFanins );
            if ( p->pCnf == NULL )
            {
p->timeSatSat += Abc_Clock() - clk;
//                printf( " Sat\n" );
//                printf( "-" );
                continue;
            }
p->timeSatUnsat += Abc_Clock() - clk;
//            printf( "+" );

            p->nProvedSets++;
//            printf( " Unsat\n" );
//            continue;
//            printf( "Proved %d.\n", k );

            // write it into a file
//            Sto_ManDumpClauses( p->pCnf, "trace.cnf" );

            // interpolate the problem if it was UNSAT
clk = Abc_Clock();
            nFanins = Int_ManInterpolate( p->pMan, p->pCnf, 0, &puTruth );
p->timeInt += Abc_Clock() - clk;
            if ( nFanins != Vec_PtrSize(vFanins) - 2 )
                continue;
            assert( puTruth );
//            Extra_PrintBinary( stdout, puTruth, 1 << nFanins );  printf( "\n" );

            // transform interpolant into the AIG
            pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );

            // derive the AIG for the decomposition tree
            pFunc = Kit_GraphToHop( (Hop_Man_t *)pNtk->pManFunc, pGraph );
            Kit_GraphFree( pGraph );

            // update the network
clk = Abc_Clock();
            Res_UpdateNetwork( pObj, Vec_VecEntry(p->vResubsW, k), pFunc, p->vLevels );
p->timeUpd += Abc_Clock() - clk;
            break;
        }
//        printf( "\n" );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkStopReverseLevels( pNtk );

p->timeSatSim += p->pSim->timeSat;
p->timeSatTotal = p->timeSatSat + p->timeSatUnsat + p->timeSatSim;

    p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);

    // quit resubstitution manager
p->timeTotal = Abc_Clock() - clkTotal;
    Res_ManFree( p );

s_ResynTime += Abc_Clock() - clkTotal;
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Abc_NtkResynthesize(): Network check has failed.\n" );
        return 0;
    }
    return 1;
}